

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>
::AdvancePastEmptyBuckets
          (DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>
           *this)

{
  bool bVar1;
  unsigned_short *puVar2;
  bool local_22;
  bool local_21;
  unsigned_short local_14;
  unsigned_short local_12;
  unsigned_short Tombstone;
  DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>
  *pDStack_10;
  unsigned_short Empty;
  DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>
  *this_local;
  
  pDStack_10 = this;
  if (this->Ptr <= this->End) {
    local_12 = DenseMapInfo<unsigned_short>::getEmptyKey();
    local_14 = DenseMapInfo<unsigned_short>::getTombstoneKey();
    while( true ) {
      local_21 = false;
      if (this->Ptr != this->End) {
        puVar2 = detail::DenseSetPair<unsigned_short>::getFirst(this->Ptr);
        bVar1 = DenseMapInfo<unsigned_short>::isEqual(puVar2,&local_12);
        local_22 = true;
        if (!bVar1) {
          puVar2 = detail::DenseSetPair<unsigned_short>::getFirst(this->Ptr);
          local_22 = DenseMapInfo<unsigned_short>::isEqual(puVar2,&local_14);
        }
        local_21 = local_22;
      }
      if (local_21 == false) break;
      this->Ptr = this->Ptr + 1;
    }
    return;
  }
  __assert_fail("Ptr <= End",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x4e0,
                "void llvm::DenseMapIterator<unsigned short, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>::AdvancePastEmptyBuckets() [KeyT = unsigned short, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<unsigned short>, Bucket = llvm::detail::DenseSetPair<unsigned short>, IsConst = false]"
               );
}

Assistant:

void AdvancePastEmptyBuckets() {
    assert(Ptr <= End);
    const KeyT Empty = KeyInfoT::getEmptyKey();
    const KeyT Tombstone = KeyInfoT::getTombstoneKey();

    while (Ptr != End && (KeyInfoT::isEqual(Ptr->getFirst(), Empty) ||
                          KeyInfoT::isEqual(Ptr->getFirst(), Tombstone)))
      ++Ptr;
  }